

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cs_impl::
cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::path_cs_ext::path_info_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::path_cs_ext::path_info_&)>
::_call<0>(cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::path_cs_ext::path_info_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::path_cs_ext::path_info_&)>
           *this,vector *args,sequence<0> *param_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  var *in_stack_000000d0;
  path_info *in_stack_ffffffffffffffc0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cs_impl::path_cs_ext::path_info_&)>
  *in_stack_ffffffffffffffc8;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  try_convert_and_check<const_cs_impl::path_cs_ext::path_info_&,_const_cs_impl::path_cs_ext::path_info_&,_cs_impl::path_cs_ext::path_info,_0UL>
  ::convert(in_stack_000000d0);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cs_impl::path_cs_ext::path_info_&)>
  ::operator()(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pbVar1 = type_convertor<std::__cxx11::string,std::__cxx11::string>::convert<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffffc0);
  std::__cxx11::string::string((string *)in_RDI,(string *)pbVar1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return in_RDI;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}